

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmbstr.c
# Opt level: O2

tmbstr prvTidytmbstrdup(TidyAllocator *allocator,ctmbstr str)

{
  char cVar1;
  uint uVar2;
  tmbstr ptVar3;
  long lVar4;
  
  if (str != (ctmbstr)0x0) {
    uVar2 = prvTidytmbstrlen(str);
    ptVar3 = (tmbstr)(*allocator->vtbl->alloc)(allocator,(long)uVar2 + 1);
    lVar4 = 0;
    do {
      cVar1 = str[lVar4];
      ptVar3[lVar4] = cVar1;
      lVar4 = lVar4 + 1;
    } while (cVar1 != '\0');
    return ptVar3;
  }
  return (tmbstr)0x0;
}

Assistant:

tmbstr TY_(tmbstrdup)( TidyAllocator *allocator, ctmbstr str )
{
    tmbstr s = NULL;
    if ( str )
    {
        uint len = TY_(tmbstrlen)( str );
        tmbstr cp = s = (tmbstr) TidyAlloc( allocator, 1+len );
        while ( 0 != (*cp++ = *str++) )
            /**/;
    }
    return s;
}